

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_cmac_process(aes_context *ctx,uint8_t *block,uint8_t *buffer,uint32_t size)

{
  size_t k;
  long lVar1;
  uint32_t i;
  uint uVar2;
  
  if ((size & 0xf) == 0) {
    for (uVar2 = 0; uVar2 < size; uVar2 = uVar2 + 0x10) {
      for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
        block[lVar1] = block[lVar1] ^ buffer[lVar1];
      }
      aes_encrypt(ctx,block,block);
      buffer = buffer + 0x10;
    }
    return;
  }
  __assert_fail("size % 16 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/soarqin[P]psvimgtools/aes.c",
                0x213,
                "void aes_cmac_process(const aes_context *, uint8_t *, const uint8_t *, uint32_t)");
}

Assistant:

static void aes_cmac_process(const aes_context* ctx, uint8_t* block, const uint8_t *buffer, uint32_t size)
{
    assert(size % 16 == 0);

#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_cmac_process_x86(ctx, block, buffer, size);
        return;
    }
#endif
    for (uint32_t i = 0; i < size; i += 16)
    {
        for (size_t k = 0; k < 16; k++)
        {
            block[k] ^= *buffer++;
        }
        aes_ecb_encrypt(ctx, block, block);
    }
}